

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::generateUnaryLOperation
          (IMC_Generator *this,OperationType comb,HexOp op_acc,shared_ptr<nigel::IM_Operator> *op,
          shared_ptr<nigel::Token> *token,bool changeValue,u16 iterations)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  HexOp HVar3;
  bool bVar4;
  element_type *peVar5;
  shared_ptr<nigel::IM_Operator> local_250;
  shared_ptr<nigel::IM_Operator> local_240;
  int local_22c;
  undefined1 local_228 [4];
  int i_4;
  shared_ptr<nigel::IM_Operator> local_218;
  int local_204;
  undefined1 local_200 [4];
  int i_3;
  shared_ptr<nigel::IM_Operator> local_1f0;
  shared_ptr<nigel::Token> local_1e0;
  shared_ptr<nigel::IM_Operator> local_1d0;
  shared_ptr<nigel::IM_Operator> local_1c0;
  shared_ptr<nigel::IM_Operator> local_1b0;
  shared_ptr<nigel::IM_Operator> local_1a0;
  int local_18c;
  undefined1 local_188 [4];
  int i_2;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  IM_Operator local_158;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  int local_104;
  undefined1 local_100 [4];
  int i_1;
  shared_ptr<nigel::IM_Operator> local_f0;
  shared_ptr<nigel::IM_Operator> local_e0;
  shared_ptr<nigel::IM_Operator> local_d0;
  IM_Operator local_c0;
  shared_ptr<nigel::IM_Operator> local_a0;
  shared_ptr<nigel::IM_Operator> local_90;
  shared_ptr<nigel::IM_Operator> local_80;
  int local_70;
  int i;
  shared_ptr<nigel::IM_Operator> local_60;
  shared_ptr<nigel::IM_Operator> local_50;
  undefined1 local_40 [31];
  bool changeValue_local;
  shared_ptr<nigel::Token> *token_local;
  shared_ptr<nigel::IM_Operator> *op_local;
  HexOp op_acc_local;
  OperationType comb_local;
  IMC_Generator *this_local;
  
  local_40[0x17] = changeValue;
  unique0x100009cd = token;
  token_local = (shared_ptr<nigel::Token> *)op;
  op_local._0_4_ = op_acc;
  op_local._4_4_ = comb;
  _op_acc_local = this;
  if (comb == v) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               op);
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_40);
    peVar5 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_40);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_50,op);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_60,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_50,&local_60);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_60);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_50);
      for (local_70 = 0; HVar3 = (HexOp)op_local, local_70 < (int)(uint)iterations;
          local_70 = local_70 + 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_80,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_90,(nullptr_t)0x0);
        addCmd(this,HVar3,&local_80,&local_90);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_90);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_80);
      }
      if ((local_40[0x17] & 1) != 0) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a0,op);
        p_Var1 = &local_c0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,mov_adr_a,&local_a0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_c0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a0);
      }
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)op);
      IM_Operator::as<nigel::IM_Variable>(&local_c0);
      peVar5 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_c0);
      iVar2 = *(int *)&(peVar5->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_c0);
      if (iVar2 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_d0,op);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_e0,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_d0,&local_e0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_e0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_d0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_f0,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)local_100,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_f0,(shared_ptr<nigel::IM_Operator> *)local_100);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)local_100);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_f0);
        for (local_104 = 0; HVar3 = (HexOp)op_local, local_104 < (int)(uint)iterations;
            local_104 = local_104 + 1) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_118,(nullptr_t)0x0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_128,(nullptr_t)0x0);
          addCmd(this,HVar3,&local_118,&local_128);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_128);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_118);
        }
        if ((local_40[0x17] & 1) != 0) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_138,(nullptr_t)0x0);
          p_Var1 = &local_158.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
          addCmd(this,movx_dptr_a,&local_138,(shared_ptr<nigel::IM_Operator> *)p_Var1);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)
                     &local_158.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                      super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_138);
        }
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)op);
        IM_Operator::as<nigel::IM_Variable>(&local_158);
        peVar5 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_158);
        bVar4 = IM_Variable::isOnStack(peVar5);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_158);
        if (bVar4) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_168,op);
          generateLoadStackR0(this,&local_168);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_168);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_178,op);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)local_188,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_178,(shared_ptr<nigel::IM_Operator> *)local_188);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)local_188);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_178);
          for (local_18c = 0; HVar3 = (HexOp)op_local, local_18c < (int)(uint)iterations;
              local_18c = local_18c + 1) {
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1a0,(nullptr_t)0x0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1b0,(nullptr_t)0x0);
            addCmd(this,HVar3,&local_1a0,&local_1b0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1b0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1a0);
          }
          if ((local_40[0x17] & 1) != 0) {
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1c0,(nullptr_t)0x0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1d0,(nullptr_t)0x0);
            addCmd(this,mov_atr0_a,&local_1c0,&local_1d0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1d0);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1c0);
          }
        }
      }
    }
  }
  else if (comb == c) {
    std::shared_ptr<nigel::Token>::shared_ptr(&local_1e0,token);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,imp_operationOnConstantCanBePrevented,&local_1e0);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_1e0);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1f0,op);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)local_200,(nullptr_t)0x0);
    addCmd(this,mov_a_const,&local_1f0,(shared_ptr<nigel::IM_Operator> *)local_200);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr((shared_ptr<nigel::IM_Operator> *)local_200);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1f0);
    for (local_204 = 0; HVar3 = (HexOp)op_local, local_204 < (int)(uint)iterations;
        local_204 = local_204 + 1) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_218,(nullptr_t)0x0);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)local_228,(nullptr_t)0x0);
      addCmd(this,HVar3,&local_218,(shared_ptr<nigel::IM_Operator> *)local_228);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr((shared_ptr<nigel::IM_Operator> *)local_228);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_218);
    }
  }
  else if (comb == t) {
    op_local._4_4_ = 2;
    for (local_22c = 0; HVar3 = (HexOp)op_local, local_22c < (int)(uint)iterations;
        local_22c = local_22c + 1) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_240,(nullptr_t)0x0);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_250,(nullptr_t)0x0);
      addCmd(this,HVar3,&local_240,&local_250);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_250);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_240);
    }
  }
  return;
}

Assistant:

void IMC_Generator::generateUnaryLOperation( OperationType comb, HexOp op_acc, std::shared_ptr<IM_Operator> op, std::shared_ptr<Token> token, bool changeValue, u16 iterations )
	{
		if( comb == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
				for( int i = 0 ; i < iterations ; i++ )
					addCmd( op_acc );
				if( changeValue ) addCmd( HexOp::mov_adr_a, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
				for( int i = 0 ; i < iterations ; i++ )
					addCmd( op_acc );
				if( changeValue ) addCmd( HexOp::movx_dptr_a );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0, op );
				for( int i = 0 ; i < iterations ; i++ )
					addCmd( op_acc );
				if( changeValue ) addCmd( HexOp::mov_atr0_a );
			}
		}
		else if( comb == OT::c )
		{
			generateNotification( NT::imp_operationOnConstantCanBePrevented, token );
			addCmd( HexOp::mov_a_const, op );
			for( int i = 0 ; i < iterations ; i++ )
				addCmd( op_acc );
		}
		else if( comb == OT::t )
		{
			for( int i = 0 ; i < iterations ; i++ )
				addCmd( op_acc );
		}
	}